

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::BSTerase
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,iterator *position)

{
  treeNode<int> *u;
  node *pnVar1;
  treeNode<int> *ptVar2;
  undefined1 local_50 [8];
  iterator temp;
  treeNode<int> *ptStack_30;
  Colour origYColour;
  node *x;
  node *y;
  node *z;
  iterator *position_local;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  detach(this);
  u = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::node(position);
  temp.m_node._4_4_ = u->colour;
  ptVar2 = u->left;
  pnVar1 = NIL(this);
  if (ptVar2 == pnVar1) {
    ptStack_30 = u->right;
    transplant(this,u,u->right);
  }
  else {
    ptVar2 = u->right;
    pnVar1 = NIL(this);
    if (ptVar2 == pnVar1) {
      ptStack_30 = u->left;
      transplant(this,u,u->left);
    }
    else {
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
                ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_50,position);
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
                ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_50);
      ptVar2 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::node
                         ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_50);
      temp.m_node._4_4_ = ptVar2->colour;
      ptStack_30 = ptVar2->right;
      if (ptVar2->parent == u) {
        ptStack_30->parent = ptVar2;
      }
      else {
        transplant(this,ptVar2,ptVar2->right);
        ptVar2->right = u->right;
        ptVar2->right->parent = ptVar2;
      }
      transplant(this,u,ptVar2);
      ptVar2->left = u->left;
      ptVar2->left->parent = ptVar2;
      ptVar2->colour = u->colour;
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator
                ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_50);
    }
  }
  allocator<ft::treeNode<int>_>::destroy((allocator<ft::treeNode<int>_> *)&this->field_0x39,u);
  allocator<ft::treeNode<int>_>::deallocate((allocator<ft::treeNode<int>_> *)&this->field_0x39,u,1);
  if (temp.m_node._4_4_ == BLACK) {
    fixEraseViolation(this,ptStack_30);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}